

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DRender.cpp
# Opt level: O1

void distributed_render_scene
               (Scene *scene,double half_width,double half_height,int nx,int ny,int nx_sub,
               int ny_sub,char *fname)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  TargaImage *this;
  int iVar8;
  int iVar9;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar10;
  double y1;
  Ray ray;
  double local_148;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  undefined8 uStack_100;
  Color local_a0;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  Ray local_60;
  
  auVar1._8_4_ = in_XMM0_Dc;
  auVar1._0_8_ = half_width;
  auVar1._12_4_ = in_XMM0_Dd;
  this = (TargaImage *)operator_new(0x40);
  TargaImage::TargaImage(this,fname,nx,ny,(char *)0x0);
  if (0 < ny) {
    uStack_100 = auVar1._8_8_;
    local_88 = (half_width + half_width) / (double)nx;
    dVar10 = (half_height + half_height) / (double)ny;
    local_78 = local_88 / (double)nx_sub;
    uStack_70 = uStack_100;
    dVar2 = (double)(ny_sub * nx_sub);
    iVar5 = 0;
    uStack_80 = uStack_100;
    dVar3 = local_88 * -0.5;
    local_148 = half_height;
    do {
      if (0 < nx) {
        iVar6 = 0;
        local_120 = -half_width;
        do {
          TotalPixels = TotalPixels + 1;
          if (nx_sub < 1) {
            local_138 = 0.0;
            local_130 = 0.0;
            local_128 = 0.0;
          }
          else {
            local_128 = 0.0;
            iVar9 = 0;
            local_130 = 0.0;
            local_138 = 0.0;
            do {
              if (0 < ny_sub) {
                iVar8 = 0;
                do {
                  iVar7 = rand();
                  dVar4 = ((double)iVar7 / 2147483647.0 + (double)iVar9) * local_78;
                  iVar7 = rand();
                  Scene::camera(scene,dVar4 + dVar3 + local_120,
                                ((double)iVar7 / 2147483647.0 + (double)iVar8) *
                                (dVar10 / (double)ny_sub) + dVar10 * -0.5 + local_148,&local_60);
                  Scene::trace(&local_a0,scene,&Grayzer::Medium::air,1.0,&local_60);
                  local_138 = local_138 + local_a0.x;
                  local_130 = local_130 + local_a0.y;
                  local_128 = local_128 + local_a0.z;
                  iVar8 = iVar8 + 1;
                } while (ny_sub != iVar8);
              }
              iVar9 = iVar9 + 1;
            } while (iVar9 != nx_sub);
          }
          (*(this->super_Image)._vptr_Image[3])
                    (this,(ulong)((int)((local_138 / dVar2) * 255.0) & 0xffU |
                                 ((int)((local_130 / dVar2) * 255.0) & 0xffU) << 8 |
                                 (int)((local_128 / dVar2) * 255.0) << 0x10));
          iVar6 = iVar6 + 1;
          local_120 = local_120 + local_88;
        } while (iVar6 != nx);
      }
      iVar5 = iVar5 + 1;
      local_148 = local_148 - dVar10;
    } while (iVar5 != ny);
  }
  (*(this->super_Image)._vptr_Image[1])();
  return;
}

Assistant:

void distributed_render_scene(
   Scene* scene,
   double half_width, double half_height,
   int   nx,   int   ny,
   int   nx_sub,  int   ny_sub,
   char const* fname )
{
   double x,y;                // sample point
   Ray   ray;                 // pixel ray
   double hx = 2.0   * half_width / nx;      // pixel width
   double hy = 2.0   * half_height /   ny;      // pixel height
   double hx_sub =   hx / nx_sub;         // hz subdivision
   double hy_sub =   hy / ny_sub;         // vt subdivision
   int   i,j;
   int   primary_samples   = nx_sub * ny_sub; // # of samples for each  pixel
   Vector color;

   // make  next in  some higher-level module as: RenderOutFile = new Targa...
   auto tga = std::make_unique<TargaImage>( fname,nx,ny );
   rgb   c;

   for( i = 0, y =   half_height; i < ny; i++, y   -= hy )
   {
      for( j = 0, x =   -half_width; j < nx; j++, x   += hx )
      {
         double x1 = x -   0.5   * hx;
         double y1 = y -   0.5   * hy;
         color =  0;

         TotalPixels++;

         for( int iSub =   0; iSub  < nx_sub; iSub++ )
            for( int jSub =   0; jSub  < ny_sub; jSub++ )
            {
               scene->camera(x1 + hx_sub * (iSub + rnd()),
                     y1 +  hy_sub * (jSub + rnd()), ray );
               color += scene->trace(Grayzer::Medium::air, 1.0, ray);
            }
         color /= primary_samples;
         clip(color);

         c.r   = color.x * 255;
         c.g   = color.y * 255;
         c.b   = color.z * 255;

         tga->put_pixel(c);
      }
   }
}